

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Token * __thiscall enact::Lexer::number(Token *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  pointer pcVar2;
  TokenType type;
  
  while( true ) {
    pcVar2 = (this->m_source)._M_dataplus._M_p;
    cVar1 = pcVar2[this->m_current];
    if (9 < (byte)(cVar1 - 0x30U)) break;
    advance(this);
  }
  type = INTEGER;
  if ((cVar1 == '.') && ((byte)(pcVar2[this->m_current + 1] - 0x30U) < 10)) {
    type = FLOAT;
    do {
      advance(this);
    } while ((byte)((this->m_source)._M_dataplus._M_p[this->m_current] - 0x30U) < 10);
  }
  makeToken(__return_storage_ptr__,this,type);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::number() {
        while (isDigit(peek())) advance();

        TokenType type = TokenType::INTEGER;

        if (peek() == '.' && isDigit(peekNext())) {
            type = TokenType::FLOAT;
            advance();
            while (isDigit(peek())) advance();
        }

        return makeToken(type);
    }